

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecPointwiseMult(axbVec_s *w,axbVec_s *x,axbVec_s *y)

{
  _func_axbStatus_t_axbVec_s_ptr_axbVec_s_ptr_axbVec_s_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  axbVec_s *y_local;
  axbVec_s *x_local;
  axbVec_s *w_local;
  
  op_desc._48_8_ = y;
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      if (w->init == 0x1d232) {
        memcpy(&op,w->opBackend->op_table + 0x15,0x38);
        (*op)(w,x,(axbVec_s *)op_desc._48_8_,op_desc.func);
        w_local._4_4_ = 0;
      }
      else {
        fprintf(_stderr,"Vector not fully initialized!\n");
        w_local._4_4_ = 0x1d232;
      }
    }
    else {
      fprintf(_stderr,"Vector not fully initialized!\n");
      w_local._4_4_ = 0x1d232;
    }
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    w_local._4_4_ = 0x1d232;
  }
  return w_local._4_4_;
}

Assistant:

axbStatus_t axbVecPointwiseMult(struct axbVec_s *w, const struct axbVec_s *x, const struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);
  AXB_VECTOR_INIT_CHECK(w);

  axbOpDescriptor_t op_desc = w->opBackend->op_table[AXB_OP_VEC_POINTWISEMULT];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbVec_s *, const struct axbVec_s *, void*)) op_desc.func;
  op(w, x, y, op_desc.func_data);
  return 0;
}